

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O0

void __thiscall solitaire::events::EventsProcessor::processEvents(EventsProcessor *this)

{
  bool bVar1;
  uint uVar2;
  pointer pEVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Variadic_union<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
  local_1c;
  Event event;
  EventsProcessor *this_local;
  
  event.
  super__Variant_base<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
  .
  super__Move_assign_alias<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
  .
  super__Copy_assign_alias<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
  .
  super__Move_ctor_alias<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
  .
  super__Copy_ctor_alias<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
  .
  super__Variant_storage_alias<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
  ._4_8_ = this;
  pEVar3 = std::
           unique_ptr<solitaire::events::interfaces::EventsSource,_std::default_delete<solitaire::events::interfaces::EventsSource>_>
           ::operator->(&this->eventsSource);
  local_1c._0_4_ = (*pEVar3->_vptr_EventsSource[2])();
  local_1c._4_4_ = extraout_var;
  while( true ) {
    bVar1 = eventOccured(this,(Event *)&local_1c);
    if (!bVar1) {
      return;
    }
    processEvent(this,(Event *)&local_1c);
    uVar2 = (*(this->super_EventsProcessor)._vptr_EventsProcessor[3])();
    if ((uVar2 & 1) != 0) break;
    pEVar3 = std::
             unique_ptr<solitaire::events::interfaces::EventsSource,_std::default_delete<solitaire::events::interfaces::EventsSource>_>
             ::operator->(&this->eventsSource);
    local_1c._0_4_ = (*pEVar3->_vptr_EventsSource[2])();
    local_1c._4_4_ = extraout_var_00;
  }
  return;
}

Assistant:

void EventsProcessor::processEvents() {
    Event event = eventsSource->getEvent();
    while (eventOccured(event)) {
        processEvent(event);
        if (shouldQuit()) return;
        event = eventsSource->getEvent();
    }
}